

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::BVHNRefitT
          (BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this,BVH *bvh,
          Builder *builder,TriangleMesh *mesh,size_t mode)

{
  BVHNRefitter<4> *this_00;
  
  (this->super_Builder).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Builder).super_RefCount._vptr_RefCount = (_func_int **)&PTR__BVHNRefitT_0221d178;
  (this->super_LeafBoundsInterface)._vptr_LeafBoundsInterface = (_func_int **)&DAT_0221d1c8;
  this->bvh = bvh;
  (this->builder)._M_t.super___uniq_ptr_impl<embree::Builder,_std::default_delete<embree::Builder>_>
  ._M_t.super__Tuple_impl<0UL,_embree::Builder_*,_std::default_delete<embree::Builder>_>.
  super__Head_base<0UL,_embree::Builder_*,_false>._M_head_impl = builder;
  this_00 = (BVHNRefitter<4> *)operator_new(0x818);
  BVHNRefitter<4>::BVHNRefitter(this_00,bvh,&this->super_LeafBoundsInterface);
  (this->refitter)._M_t.
  super___uniq_ptr_impl<embree::avx::BVHNRefitter<4>,_std::default_delete<embree::avx::BVHNRefitter<4>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::avx::BVHNRefitter<4>_*,_std::default_delete<embree::avx::BVHNRefitter<4>_>_>
  .super__Head_base<0UL,_embree::avx::BVHNRefitter<4>_*,_false>._M_head_impl = this_00;
  this->mesh = mesh;
  this->topologyVersion = 0;
  return;
}

Assistant:

BVHNRefitT<N,Mesh,Primitive>::BVHNRefitT (BVH* bvh, Builder* builder, Mesh* mesh, size_t mode)
      : bvh(bvh), builder(builder), refitter(new BVHNRefitter<N>(bvh,*(typename BVHNRefitter<N>::LeafBoundsInterface*)this)), mesh(mesh), topologyVersion(0) {}